

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlattribute.cpp
# Opt level: O3

bool __thiscall libcellml::XmlAttribute::inNamespaceUri(XmlAttribute *this,char *ns)

{
  int iVar1;
  string local_30;
  
  namespaceUri_abi_cxx11_(&local_30,this);
  iVar1 = xmlStrcmp(local_30._M_dataplus._M_p,ns);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return iVar1 == 0;
}

Assistant:

bool XmlAttribute::inNamespaceUri(const char *ns) const
{
    return xmlStrcmp(reinterpret_cast<const xmlChar *>(namespaceUri().c_str()), reinterpret_cast<const xmlChar *>(ns)) == 0;
}